

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::checkSameOperands(CheckerVisitor *this,BinExpr *expr)

{
  Expr *e;
  bool bVar1;
  ulong uVar2;
  Node *lhs;
  Node *rhs;
  char *pcVar3;
  
  if (((this->effectsOnly == false) &&
      (uVar2 = (ulong)(expr->super_Expr).super_Node._op, uVar2 < 0x2b)) &&
     ((0x5b9ffe00000U >> (uVar2 & 0x3f) & 1) != 0)) {
    e = expr->_rhs;
    lhs = &deparen(expr->_lhs)->super_Node;
    rhs = &deparen(e)->super_Node;
    bVar1 = NodeEqualChecker::check((NodeEqualChecker *)&this->field_0x20,lhs,rhs);
    if ((bVar1) && ((lhs->_op != TO_LITERAL || (1 < *(int *)&lhs->field_0x1c - 1U)))) {
      pcVar3 = treeopStr((expr->super_Expr).super_Node._op);
      report(this,(Node *)expr,0x47,pcVar3);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkSameOperands(const BinExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (isSuspiciousSameOperandsBinaryOp(expr->op())) {
    const Expr *ll = deparen(l);
    const Expr *rr = deparen(r);

    if (_equalChecker.check(ll, rr)) {
      if (ll->op() != TO_LITERAL || (ll->asLiteral()->kind() != LK_FLOAT && ll->asLiteral()->kind() != LK_INT)) { // -V522
        report(expr, DiagnosticsId::DI_SAME_OPERANDS, treeopStr(expr->op()));
      }
    }
  }
}